

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_unix_util.c
# Opt level: O0

PaError PaUtil_CancelThreading(PaUtilThreading *threading,int wait,PaError *exitResult)

{
  PaError *local_30;
  void *pret;
  PaError *pPStack_20;
  PaError result;
  PaError *exitResult_local;
  PaUtilThreading *pPStack_10;
  int wait_local;
  PaUtilThreading *threading_local;
  
  pret._4_4_ = 0;
  if (exitResult != (PaError *)0x0) {
    *exitResult = 0;
  }
  pPStack_20 = exitResult;
  exitResult_local._4_4_ = wait;
  pPStack_10 = threading;
  if (wait == 0) {
    pthread_cancel(threading->callbackThread);
  }
  pthread_join(pPStack_10->callbackThread,&local_30);
  if ((local_30 != (PaError *)0x0) && (local_30 != (PaError *)0xffffffffffffffff)) {
    if (pPStack_20 != (PaError *)0x0) {
      *pPStack_20 = *local_30;
    }
    free(local_30);
  }
  return pret._4_4_;
}

Assistant:

PaError PaUtil_CancelThreading( PaUtilThreading *threading, int wait, PaError *exitResult )
{
    PaError result = paNoError;
    void *pret;

    if( exitResult )
        *exitResult = paNoError;

    /* If pthread_cancel is not supported (Android platform) whole this function can lead to indefinite waiting if
       working thread (callbackThread) has'n received any stop signals from outside, please keep
       this in mind when considering using PaUtil_CancelThreading
    */
#ifdef PTHREAD_CANCELED
    /* Only kill the thread if it isn't in the process of stopping (flushing adaptation buffers) */
    if( !wait )
        pthread_cancel( threading->callbackThread );   /* XXX: Safe to call this if the thread has exited on its own? */
#endif
    pthread_join( threading->callbackThread, &pret );

#ifdef PTHREAD_CANCELED
    if( pret && PTHREAD_CANCELED != pret )
#else
    /* !wait means the thread may have been canceled */
    if( pret && wait )
#endif
    {
        if( exitResult )
            *exitResult = *(PaError *) pret;
        free( pret );
    }

    return result;
}